

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.h
# Opt level: O1

void __thiscall Clasp::DefaultUnfoundedCheck::AddSource::operator()(AddSource *this,NodeId bId)

{
  uint32 *puVar1;
  uint uVar2;
  DefaultUnfoundedCheck *this_00;
  BodyPtr local_10;
  
  this_00 = this->self;
  local_10.node = (this_00->graph_->bodies_).ebo_.buf + bId;
  puVar1 = &(this_00->bodies_).ebo_.buf[bId].lower_or_ext;
  *puVar1 = *puVar1 - 1;
  if ((*puVar1 == 0) &&
     (uVar2 = ((local_10.node)->super_Node).lit.rep_,
     (byte)(*(byte *)((long)(this_00->solver_->assign_).assign_.ebo_.buf +
                     (ulong)(uVar2 & 0xfffffffc)) & 3) != (byte)(((uVar2 & 2) == 0) + 1U))) {
    local_10.id = bId;
    forwardSource(this_00,&local_10);
  }
  return;
}

Assistant:

void operator()(NodeId bId) const {
			BodyPtr n(self->getBody(bId));
			if (--self->bodies_[bId].lower_or_ext == 0 && !self->solver_->isFalse(n.node->lit)) { self->forwardSource(n); }
		}